

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_lha.c
# Opt level: O0

wchar_t lzh_make_huffman_table(huffman_conflict *hf)

{
  wchar_t wVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  uint16_t *puVar4;
  uchar *puVar5;
  short sVar6;
  uint16_t uVar7;
  uint uVar8;
  uint16_t *__dest;
  ushort *puVar9;
  byte bVar10;
  uint16_t *local_120;
  uint16_t *pc;
  htree_t *ht;
  wchar_t extlen;
  uint16_t bit;
  wchar_t cnt;
  wchar_t len;
  uint16_t *p_1;
  uint16_t *p;
  uint htbl_max;
  wchar_t ebits;
  wchar_t len_avail;
  wchar_t diffbits;
  wchar_t w;
  wchar_t tbl_size;
  wchar_t ptn;
  wchar_t maxbits;
  wchar_t i;
  wchar_t weight [17];
  wchar_t awStack_78 [2];
  wchar_t bitptn [17];
  uchar *bitlen;
  uint16_t *tbl;
  huffman_conflict *hf_local;
  
  tbl_size = L'\0';
  w = L'\0';
  len_avail = L'耀';
  for (ptn = L'\x01'; ptn < L'\x11'; ptn = ptn + L'\x01') {
    awStack_78[ptn] = w;
    (&maxbits)[ptn] = len_avail;
    if (hf->freq[ptn] != L'\0') {
      w = hf->freq[ptn] * len_avail + w;
      tbl_size = ptn;
    }
    len_avail = len_avail >> 1;
  }
  if ((w == L'𐀀') && (tbl_size <= hf->tbl_bits)) {
    hf->max_bits = tbl_size;
    if (tbl_size < L'\x10') {
      bVar10 = 0x10 - (char)tbl_size;
      for (ptn = L'\x01'; ptn <= tbl_size; ptn = ptn + L'\x01') {
        awStack_78[ptn] = awStack_78[ptn] >> (bVar10 & 0x1f);
        (&maxbits)[ptn] = (&maxbits)[ptn] >> (bVar10 & 0x1f);
      }
    }
    if (tbl_size < L'\v') {
      ebits = L'\0';
    }
    else {
      ebits = tbl_size + L'\xfffffff6';
      for (ptn = L'\x01'; ptn < L'\v'; ptn = ptn + L'\x01') {
        awStack_78[ptn] = awStack_78[ptn] >> ((byte)ebits & 0x1f);
        (&maxbits)[ptn] = (&maxbits)[ptn] >> ((byte)ebits & 0x1f);
      }
      p_1 = hf->tbl + (uint)(bitptn[8] + weight[8] * hf->freq[10]);
      while (p_1 < hf->tbl + 0x400) {
        *p_1 = 0;
        p_1 = p_1 + 1;
      }
    }
    hf->shift_bits = ebits;
    puVar4 = hf->tbl;
    puVar5 = hf->bitlen;
    wVar1 = hf->len_avail;
    hf->tree_used = L'\0';
    for (ptn = L'\0'; ptn < wVar1; ptn = ptn + L'\x01') {
      if (puVar5[ptn] != '\0') {
        uVar8 = (uint)puVar5[ptn];
        wVar2 = awStack_78[(int)uVar8];
        wVar3 = (&maxbits)[(int)uVar8];
        uVar7 = (uint16_t)ptn;
        if (uVar8 < 0xb) {
          awStack_78[(int)uVar8] = wVar2 + wVar3;
          if (L'Ѐ' < wVar2 + wVar3) {
            return L'\0';
          }
          __dest = puVar4 + wVar2;
          extlen = wVar3;
          if (wVar3 < L'\b') {
            while (L'\x01' < extlen) {
              __dest[extlen + L'\xffffffff'] = uVar7;
              __dest[extlen + L'\xfffffffe'] = uVar7;
              extlen = extlen + L'\xfffffffe';
            }
            if (extlen != L'\0') {
              __dest[extlen + L'\xffffffff'] = uVar7;
            }
          }
          else {
            extlen = wVar3 + L'\xfffffff8';
            local_120 = __dest + extlen;
            *local_120 = uVar7;
            local_120[1] = uVar7;
            local_120[2] = uVar7;
            local_120[3] = uVar7;
            local_120[4] = uVar7;
            local_120[5] = uVar7;
            local_120[6] = uVar7;
            local_120[7] = uVar7;
            if (L'\a' < extlen) {
              extlen = wVar3 + L'\xfffffff0';
              *(undefined8 *)(__dest + extlen) = *(undefined8 *)local_120;
              *(undefined8 *)(__dest + (long)extlen + 4) = *(undefined8 *)(local_120 + 4);
              local_120 = __dest + extlen;
              while (L'\x0f' < extlen) {
                extlen = extlen + L'\xfffffff0';
                *(undefined8 *)(__dest + extlen) = *(undefined8 *)local_120;
                *(undefined8 *)(__dest + (long)extlen + 4) = *(undefined8 *)(local_120 + 4);
                *(undefined8 *)(__dest + (long)extlen + 8) = *(undefined8 *)(local_120 + 8);
                *(undefined8 *)(__dest + (long)extlen + 0xc) = *(undefined8 *)(local_120 + 0xc);
              }
            }
            if (extlen != L'\0') {
              memcpy(__dest,local_120,(long)extlen << 1);
            }
          }
        }
        else {
          awStack_78[(int)uVar8] = wVar2 + wVar3;
          ht._6_2_ = (ushort)(1 << ((byte)ebits - 1 & 0x1f));
          ht._0_4_ = uVar8 - 10;
          puVar9 = puVar4 + (wVar2 >> ((byte)ebits & 0x1f));
          sVar6 = (short)wVar1;
          if (*puVar9 == 0) {
            *puVar9 = sVar6 + (short)hf->tree_used;
            wVar3 = hf->tree_used;
            hf->tree_used = wVar3 + L'\x01';
            pc = &hf->tree[wVar3].left;
            if (hf->tree_avail < hf->tree_used) {
              return L'\0';
            }
            ((htree_t *)pc)->left = 0;
            ((htree_t *)pc)->right = 0;
          }
          else {
            if (((int)(uint)*puVar9 < wVar1) || (wVar1 + hf->tree_used <= (int)(uint)*puVar9)) {
              return L'\0';
            }
            pc = &hf->tree[(uint)*puVar9 - wVar1].left;
          }
          while (ht._0_4_ = (int)ht + -1, 0 < (int)ht) {
            if ((wVar2 & (uint)ht._6_2_) == 0) {
              if ((int)(uint)pc[1] < wVar1) {
                pc[1] = sVar6 + (short)hf->tree_used;
                wVar3 = hf->tree_used;
                hf->tree_used = wVar3 + L'\x01';
                pc = &hf->tree[wVar3].left;
                if (hf->tree_avail < hf->tree_used) {
                  return L'\0';
                }
                ((htree_t *)pc)->left = 0;
                ((htree_t *)pc)->right = 0;
              }
              else {
                pc = &hf->tree[(uint)pc[1] - wVar1].left;
              }
            }
            else if ((int)(uint)*pc < wVar1) {
              *pc = sVar6 + (short)hf->tree_used;
              wVar3 = hf->tree_used;
              hf->tree_used = wVar3 + L'\x01';
              pc = &hf->tree[wVar3].left;
              if (hf->tree_avail < hf->tree_used) {
                return L'\0';
              }
              ((htree_t *)pc)->left = 0;
              ((htree_t *)pc)->right = 0;
            }
            else {
              pc = &hf->tree[(uint)*pc - wVar1].left;
            }
            ht._6_2_ = (ushort)((int)(uint)ht._6_2_ >> 1);
          }
          if ((wVar2 & (uint)ht._6_2_) == 0) {
            if (pc[1] != 0) {
              return L'\0';
            }
            pc[1] = uVar7;
          }
          else {
            if (*pc != 0) {
              return L'\0';
            }
            *pc = uVar7;
          }
        }
      }
    }
    hf_local._4_4_ = L'\x01';
  }
  else {
    hf_local._4_4_ = L'\0';
  }
  return hf_local._4_4_;
}

Assistant:

static int
lzh_make_huffman_table(struct huffman *hf)
{
	uint16_t *tbl;
	const unsigned char *bitlen;
	int bitptn[17], weight[17];
	int i, maxbits = 0, ptn, tbl_size, w;
	int diffbits, len_avail;

	/*
	 * Initialize bit patterns.
	 */
	ptn = 0;
	for (i = 1, w = 1 << 15; i <= 16; i++, w >>= 1) {
		bitptn[i] = ptn;
		weight[i] = w;
		if (hf->freq[i]) {
			ptn += hf->freq[i] * w;
			maxbits = i;
		}
	}
	if (ptn != 0x10000 || maxbits > hf->tbl_bits)
		return (0);/* Invalid */

	hf->max_bits = maxbits;

	/*
	 * Cut out extra bits which we won't house in the table.
	 * This preparation reduces the same calculation in the for-loop
	 * making the table.
	 */
	if (maxbits < 16) {
		int ebits = 16 - maxbits;
		for (i = 1; i <= maxbits; i++) {
			bitptn[i] >>= ebits;
			weight[i] >>= ebits;
		}
	}
	if (maxbits > HTBL_BITS) {
		unsigned htbl_max;
		uint16_t *p;

		diffbits = maxbits - HTBL_BITS;
		for (i = 1; i <= HTBL_BITS; i++) {
			bitptn[i] >>= diffbits;
			weight[i] >>= diffbits;
		}
		htbl_max = bitptn[HTBL_BITS] +
		    weight[HTBL_BITS] * hf->freq[HTBL_BITS];
		p = &(hf->tbl[htbl_max]);
		while (p < &hf->tbl[1U<<HTBL_BITS])
			*p++ = 0;
	} else
		diffbits = 0;
	hf->shift_bits = diffbits;

	/*
	 * Make the table.
	 */
	tbl_size = 1 << HTBL_BITS;
	tbl = hf->tbl;
	bitlen = hf->bitlen;
	len_avail = hf->len_avail;
	hf->tree_used = 0;
	for (i = 0; i < len_avail; i++) {
		uint16_t *p;
		int len, cnt;
		uint16_t bit;
		int extlen;
		struct htree_t *ht;

		if (bitlen[i] == 0)
			continue;
		/* Get a bit pattern */
		len = bitlen[i];
		ptn = bitptn[len];
		cnt = weight[len];
		if (len <= HTBL_BITS) {
			/* Calculate next bit pattern */
			if ((bitptn[len] = ptn + cnt) > tbl_size)
				return (0);/* Invalid */
			/* Update the table */
			p = &(tbl[ptn]);
			if (cnt > 7) {
				uint16_t *pc;

				cnt -= 8;
				pc = &p[cnt];
				pc[0] = (uint16_t)i;
				pc[1] = (uint16_t)i;
				pc[2] = (uint16_t)i;
				pc[3] = (uint16_t)i;
				pc[4] = (uint16_t)i;
				pc[5] = (uint16_t)i;
				pc[6] = (uint16_t)i;
				pc[7] = (uint16_t)i;
				if (cnt > 7) {
					cnt -= 8;
					memcpy(&p[cnt], pc,
						8 * sizeof(uint16_t));
					pc = &p[cnt];
					while (cnt > 15) {
						cnt -= 16;
						memcpy(&p[cnt], pc,
							16 * sizeof(uint16_t));
					}
				}
				if (cnt)
					memcpy(p, pc, cnt * sizeof(uint16_t));
			} else {
				while (cnt > 1) {
					p[--cnt] = (uint16_t)i;
					p[--cnt] = (uint16_t)i;
				}
				if (cnt)
					p[--cnt] = (uint16_t)i;
			}
			continue;
		}

		/*
		 * A bit length is too big to be housed to a direct table,
		 * so we use a tree model for its extra bits.
		 */
		bitptn[len] = ptn + cnt;
		bit = 1U << (diffbits -1);
		extlen = len - HTBL_BITS;
		
		p = &(tbl[ptn >> diffbits]);
		if (*p == 0) {
			*p = len_avail + hf->tree_used;
			ht = &(hf->tree[hf->tree_used++]);
			if (hf->tree_used > hf->tree_avail)
				return (0);/* Invalid */
			ht->left = 0;
			ht->right = 0;
		} else {
			if (*p < len_avail ||
			    *p >= (len_avail + hf->tree_used))
				return (0);/* Invalid */
			ht = &(hf->tree[*p - len_avail]);
		}
		while (--extlen > 0) {
			if (ptn & bit) {
				if (ht->left < len_avail) {
					ht->left = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->left - len_avail]);
				}
			} else {
				if (ht->right < len_avail) {
					ht->right = len_avail + hf->tree_used;
					ht = &(hf->tree[hf->tree_used++]);
					if (hf->tree_used > hf->tree_avail)
						return (0);/* Invalid */
					ht->left = 0;
					ht->right = 0;
				} else {
					ht = &(hf->tree[ht->right - len_avail]);
				}
			}
			bit >>= 1;
		}
		if (ptn & bit) {
			if (ht->left != 0)
				return (0);/* Invalid */
			ht->left = (uint16_t)i;
		} else {
			if (ht->right != 0)
				return (0);/* Invalid */
			ht->right = (uint16_t)i;
		}
	}
	return (1);
}